

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O3

Node * __thiscall Assimp::ColladaLoader::FindNodeBySID(ColladaLoader *this,Node *pNode,string *pSID)

{
  size_t __n;
  pointer ppNVar1;
  int iVar2;
  Node *pNVar3;
  long lVar4;
  long lVar5;
  
  if (pNode != (Node *)0x0) {
    __n = (pNode->mSID)._M_string_length;
    if (__n == pSID->_M_string_length) {
      if (__n == 0) {
        return pNode;
      }
      iVar2 = bcmp((pNode->mSID)._M_dataplus._M_p,(pSID->_M_dataplus)._M_p,__n);
      if (iVar2 == 0) {
        return pNode;
      }
    }
    ppNVar1 = (pNode->mChildren).
              super__Vector_base<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    lVar5 = (long)(pNode->mChildren).
                  super__Vector_base<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppNVar1;
    if (lVar5 != 0) {
      lVar5 = lVar5 >> 3;
      lVar4 = 0;
      do {
        pNVar3 = FindNodeBySID(this,ppNVar1[lVar4],pSID);
        if (pNVar3 != (Node *)0x0) {
          return pNVar3;
        }
        lVar4 = lVar4 + 1;
      } while (lVar5 + (ulong)(lVar5 == 0) != lVar4);
      return (Node *)0x0;
    }
  }
  return (Node *)0x0;
}

Assistant:

const Collada::Node* ColladaLoader::FindNodeBySID( const Collada::Node* pNode, const std::string& pSID) const {
    if (nullptr == pNode) {
        return nullptr;
    }

    if (pNode->mSID == pSID) {
        return pNode;
    }

    for( size_t a = 0; a < pNode->mChildren.size(); ++a) {
        const Collada::Node* node = FindNodeBySID( pNode->mChildren[a], pSID);
        if (node) {
            return node;
        }
    }

    return nullptr;
}